

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::SwiftGetVersionCommand::getVerboseDescription
          (SwiftGetVersionCommand *this,SmallVectorImpl<char> *result)

{
  raw_ostream *prVar1;
  raw_svector_ostream local_48;
  SmallVectorImpl<char> *local_18;
  SmallVectorImpl<char> *result_local;
  SwiftGetVersionCommand *this_local;
  
  local_18 = result;
  result_local = (SmallVectorImpl<char> *)this;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_48,result);
  prVar1 = llvm::raw_ostream::operator<<((raw_ostream *)&local_48,'\"');
  prVar1 = llvm::raw_ostream::operator<<(prVar1,&this->executable);
  prVar1 = llvm::raw_ostream::operator<<(prVar1,'\"');
  llvm::raw_ostream::operator<<(prVar1," --version");
  llvm::raw_svector_ostream::~raw_svector_ostream(&local_48);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << '"' << executable << '"'
                                      << " --version";
  }